

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliqueCollector.h
# Opt level: O0

void __thiscall
CliqueCollector::add
          (CliqueCollector *this,unique_ptr<Clique,_std::default_delete<Clique>_> *clique,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *appearanceMap)

{
  bool bVar1;
  reference ppAVar2;
  pointer this_00;
  size_type sVar3;
  AlignmentRecord *in_RDX;
  AlignmentRecord *in_RSI;
  long in_RDI;
  AlignmentRecord *al;
  AlignmentRecord **a;
  iterator __end2;
  iterator __begin2;
  vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_> *__range2;
  list<unsigned_int,_std::allocator<unsigned_int>_> cll;
  unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
  alignments;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_000008c8;
  uint in_stack_000008d4;
  unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
  *in_stack_000008d8;
  AlignmentRecord *in_stack_000008e0;
  vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>
  *in_stack_ffffffffffffff38;
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *in_stack_ffffffffffffff40;
  value_type_conflict1 *in_stack_ffffffffffffff48;
  uint id;
  undefined4 in_stack_ffffffffffffff50;
  alignment_id_t in_stack_ffffffffffffff54;
  list<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff78;
  list<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff80;
  Clique *in_stack_ffffffffffffff98;
  __normal_iterator<const_AlignmentRecord_**,_std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>
  local_58 [3];
  type local_40;
  
  std::unique_ptr<Clique,_std::default_delete<Clique>_>::operator->
            ((unique_ptr<Clique,_std::default_delete<Clique>_> *)0x24c15e);
  Clique::getAllAlignments(in_stack_ffffffffffffff98);
  if (*(long *)(in_RDI + 0x10) != 0) {
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)0x24c18b);
    local_40 = std::
               unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
               ::operator*((unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
                            *)in_stack_ffffffffffffff40);
    local_58[0]._M_current =
         (AlignmentRecord **)
         std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>::begin
                   (in_stack_ffffffffffffff38);
    std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>::end
              (in_stack_ffffffffffffff38);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_AlignmentRecord_**,_std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>
                          *)in_stack_ffffffffffffff40,
                         (__normal_iterator<const_AlignmentRecord_**,_std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>
                          *)in_stack_ffffffffffffff38);
      if (!bVar1) break;
      ppAVar2 = __gnu_cxx::
                __normal_iterator<const_AlignmentRecord_**,_std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>
                ::operator*(local_58);
      in_stack_ffffffffffffff54 = AlignmentRecord::getID(*ppAVar2);
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      __gnu_cxx::
      __normal_iterator<const_AlignmentRecord_**,_std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>
      ::operator++(local_58);
    }
    id = (uint)((ulong)*(undefined8 *)(in_RDI + 0x10) >> 0x20);
    in_stack_ffffffffffffff50 = *(undefined4 *)(in_RDI + 0x18);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    LogWriter::reportClique
              ((LogWriter *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),id,
               (list<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff40);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)0x24c28c);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)0x24c299);
  }
  this_00 = std::
            unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
            ::operator->((unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
                          *)0x24c2d5);
  sVar3 = std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>::size
                    (this_00);
  if (sVar3 < 2) {
    in_stack_ffffffffffffff38 =
         (vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_> *)
         operator_new(0x318);
    std::
    unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
    ::operator->((unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
                  *)0x24c385);
    std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>::front
              ((vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_> *)
               in_stack_ffffffffffffff40);
    AlignmentRecord::AlignmentRecord(in_RSI,in_RDX);
    *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
  }
  else {
    in_stack_ffffffffffffff40 =
         (deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)operator_new(0x318);
    *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
    AlignmentRecord::AlignmentRecord
              (in_stack_000008e0,in_stack_000008d8,in_stack_000008d4,in_stack_000008c8);
  }
  std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::push_back
            (in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
  std::
  unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  return;
}

Assistant:

void add(std::unique_ptr<Clique> clique,std::map<std::string,int>* appearanceMap) {
        assert(clique.get() != nullptr);

//        std::cerr << "Clique " << id << std::endl;
        std::unique_ptr<std::vector<const AlignmentRecord*>> alignments = clique->getAllAlignments();

        if (lw != nullptr) {
            std::list<unsigned int> cll;            
            for (const auto& a : *alignments) {
                cll.push_back(a->getID());
            }
            lw->reportClique(this->id, cll);
        }

        AlignmentRecord* al;

        if (alignments->size() > 1) {
            al = new AlignmentRecord(alignments, this->id++,appearanceMap);
        } else {
            al = new AlignmentRecord(*(alignments->front()));
            this->id++;
        }

        superReads->push_back(al);
    }